

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O0

void test_ctranslate(string *c,string *original,string *expected,locale *l,string *domain)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *in_R8;
  string *in_stack_00000d60;
  locale *in_stack_00000d68;
  string *in_stack_00000d70;
  string *in_stack_00000d78;
  string *in_stack_00000d80;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [48];
  string local_68 [32];
  string local_48 [72];
  
  std::__cxx11::string::string(local_48,in_RDI);
  std::__cxx11::string::string(local_68,in_RSI);
  std::__cxx11::string::string(local_98,in_RDX);
  std::__cxx11::string::string(local_b8,in_R8);
  strings_equal<char>(in_stack_00000d80,in_stack_00000d78,in_stack_00000d70,in_stack_00000d68,
                      in_stack_00000d60);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string(local_d8,in_RDI);
  std::__cxx11::string::string(local_f8,in_RSI);
  std::__cxx11::string::string(local_118,in_RDX);
  std::__cxx11::string::string(local_138,in_R8);
  strings_equal<wchar_t>
            (in_stack_00000d80,in_stack_00000d78,in_stack_00000d70,in_stack_00000d68,
             in_stack_00000d60);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  return;
}

Assistant:

void test_ctranslate(std::string c,std::string original,std::string expected,std::locale const &l,std::string domain)
{
    strings_equal<char>(c,original,expected,l,domain);
    strings_equal<wchar_t>(c,original,expected,l,domain);
    #ifdef BOOSTER_HAS_CHAR16_T
    if(backend=="icu" || backend=="std")
        strings_equal<char16_t>(c,original,expected,l,domain);
    #endif
    #ifdef BOOSTER_HAS_CHAR32_T
    if(backend=="icu" || backend=="std")
        strings_equal<char32_t>(c,original,expected,l,domain);
    #endif
}